

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar3;
  string *psVar4;
  char *__s;
  cmLocalNinjaGenerator *pcVar5;
  string *linkCmd_2;
  allocator<char> local_251;
  undefined1 local_250 [8];
  string linkCmdVar_2;
  string *linkCmd_1;
  allocator<char> local_201;
  undefined1 local_200 [8];
  string linkCmdVar_1;
  undefined1 local_1c0 [8];
  string cmakeCommand_1;
  string local_198;
  undefined1 local_178 [8];
  string targetOutputReal;
  string cfgName;
  cmGeneratorTarget *gt;
  string cmakeCommand;
  string local_108;
  char *local_e8;
  char *rule;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string ruleVar;
  undefined1 local_90 [8];
  string linkCmdStr;
  char *linkCmd;
  string linkCmdVar;
  cmMakefile *mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  cmNinjaNormalTargetGenerator *this_local;
  
  linkCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&mf);
  this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)&linkCmd,pcVar3,&this->TargetLinkLanguage,psVar4);
  __s = cmMakefile::GetDefinition(this_00,(string *)&linkCmd);
  linkCmdStr.field_2._8_8_ = __s;
  if (__s == (char *)0x0) {
    cmakeCommand_1.field_2._12_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,__s,(allocator<char> *)(ruleVar.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ruleVar.field_2._M_local_buf + 0xf));
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::HasImplibGNUtoMS
                      (pcVar3,&(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                               ConfigName);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"CMAKE_",&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)&rule,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
      std::__cxx11::string::operator+=((string *)local_b8,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::operator+=((string *)local_b8,"_GNUtoMS_RULE");
      local_e8 = cmMakefile::GetDefinition
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            Makefile,(string *)local_b8);
      if (local_e8 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)local_90,local_e8);
      }
      std::__cxx11::string::~string((string *)local_b8);
    }
    cmSystemTools::ExpandListArgument
              ((string *)local_90,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&mf,false);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"LINK_WHAT_YOU_USE",
               (allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    if (bVar1) {
      pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&gt,
                 &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar4,SHELL);
      std::__cxx11::string::operator+=((string *)&gt," -E __run_co_compile --lwyu=");
      pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string
                ((string *)(targetOutputReal.field_2._M_local_buf + 8),(string *)psVar4);
      cmGeneratorTarget::GetFullPath
                (&local_198,pcVar3,(string *)((long)&targetOutputReal.field_2 + 8),
                 RuntimeBinaryArtifact,true);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_178,&this->super_cmNinjaTargetGenerator,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::operator+=((string *)&gt,(string *)local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf,(value_type *)&gt);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)(targetOutputReal.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&gt);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&mf);
    cmakeCommand_1.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_90);
  }
  std::__cxx11::string::~string((string *)&linkCmd);
  if (cmakeCommand_1.field_2._12_4_ == 0) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar2 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar2 != EXECUTABLE) {
      if (TVar2 == STATIC_LIBRARY) {
        pcVar5 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)local_1c0,
                   &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,psVar4,SHELL);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&linkCmdVar_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0," -E remove $TARGET_FILE");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&mf,(value_type *)((long)&linkCmdVar_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(linkCmdVar_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"CMAKE_",&local_201);
        std::allocator<char>::~allocator(&local_201);
        std::__cxx11::string::operator+=((string *)local_200,(string *)&this->TargetLinkLanguage);
        std::__cxx11::string::operator+=((string *)local_200,"_ARCHIVE_CREATE");
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  ((string *)&linkCmd_1,pcVar3,(string *)local_200,&this->TargetLinkLanguage,psVar4)
        ;
        std::__cxx11::string::operator=((string *)local_200,(string *)&linkCmd_1);
        std::__cxx11::string::~string((string *)&linkCmd_1);
        linkCmdVar_2.field_2._8_8_ = cmMakefile::GetRequiredDefinition(this_00,(string *)local_200);
        cmSystemTools::ExpandListArgument
                  ((string *)linkCmdVar_2.field_2._8_8_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&mf,false);
        std::__cxx11::string::~string((string *)local_200);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_250,"CMAKE_",&local_251);
        std::allocator<char>::~allocator(&local_251);
        std::__cxx11::string::operator+=((string *)local_250,(string *)&this->TargetLinkLanguage);
        std::__cxx11::string::operator+=((string *)local_250,"_ARCHIVE_FINISH");
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  ((string *)&linkCmd_2,pcVar3,(string *)local_250,&this->TargetLinkLanguage,psVar4)
        ;
        std::__cxx11::string::operator=((string *)local_250,(string *)&linkCmd_2);
        std::__cxx11::string::~string((string *)&linkCmd_2);
        psVar4 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_250);
        cmSystemTools::ExpandListArgument
                  (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&mf,false);
        std::__cxx11::string::~string((string *)local_250);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&mf);
        cmakeCommand_1.field_2._12_4_ = 1;
        goto LAB_003d134b;
      }
      if (1 < TVar2 - SHARED_LIBRARY) {
        __assert_fail("false && \"Unexpected target type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmNinjaNormalTargetGenerator.cxx"
                      ,0x221,
                      "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd()");
      }
    }
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    cmakeCommand_1.field_2._12_4_ = 1;
  }
LAB_003d134b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd()
{
  std::vector<std::string> linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage, this->GetConfigName());
    const char* linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(this->ConfigName)) {
        std::string ruleVar = "CMAKE_";
        ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
        ruleVar += "_GNUtoMS_RULE";
        if (const char* rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += rule;
        }
      }
      cmSystemTools::ExpandListArgument(linkCmdStr, linkCmds);
      if (this->GetGeneratorTarget()->GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
        cmakeCommand += " -E __run_co_compile --lwyu=";
        cmGeneratorTarget& gt = *this->GetGeneratorTarget();
        const std::string cfgName = this->GetConfigName();
        std::string targetOutputReal = this->ConvertToNinjaPath(
          gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                         /*realname=*/true));
        cmakeCommand += targetOutputReal;
        linkCmds.push_back(std::move(cmakeCommand));
      }
      return linkCmds;
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E remove $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = "CMAKE_";
        linkCmdVar += this->TargetLinkLanguage;
        linkCmdVar += "_ARCHIVE_CREATE";

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage, this->GetConfigName());

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmSystemTools::ExpandListArgument(linkCmd, linkCmds);
      }
      {
        std::string linkCmdVar = "CMAKE_";
        linkCmdVar += this->TargetLinkLanguage;
        linkCmdVar += "_ARCHIVE_FINISH";

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage, this->GetConfigName());

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmSystemTools::ExpandListArgument(linkCmd, linkCmds);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
      return linkCmds;
    }
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::EXECUTABLE:
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return std::vector<std::string>();
}